

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void initAndReadFile(MultiPartInputFile *in,
                    vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *outHeaders,int part,
                    vector<partData,_std::allocator<partData>_> *parts,fileMetrics *metrics,
                    bool reread)

{
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  partSizeData *ppVar4;
  __type _Var5;
  string *psVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long local_1b8;
  InputPart inpart;
  undefined1 local_170 [72];
  string type;
  partSizeData local_108;
  undefined1 local_c0 [72];
  undefined1 local_78 [72];
  
  lVar8 = 0x78;
  lVar9 = 0x1e8;
  local_1b8 = 0;
  uVar10 = 0;
  do {
    if ((ulong)(((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x250) <= uVar10) {
      return;
    }
    uVar3 = (ulong)(uint)part;
    if (part == -1) {
      uVar3 = uVar10;
    }
    Imf_3_4::MultiPartInputFile::header((int)in);
    psVar6 = (string *)Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::string((string *)&type,psVar6);
    _Var5 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
    iVar7 = (int)uVar3;
    if (_Var5) {
      Imf_3_4::InputPart::InputPart(&inpart,in,iVar7);
      ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
               super__Vector_impl_data._M_start;
      initScanLine((partSizeData *)local_170,
                   (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)((long)ppVar1 + lVar9 + -0x1e8),(FrameBuffer *)((long)ppVar1 + lVar9 + -0x170)
                   ,&inpart,(outHeaders->
                            super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
                            _M_impl.super__Vector_impl_data._M_start + local_1b8);
      partSizeData::operator=
                ((partSizeData *)
                 ((long)&(((metrics->stats).
                           super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                           super__Vector_impl_data._M_start)->countReadPerf).
                         super__Vector_base<double,_std::allocator<double>_> + lVar8),
                 (partSizeData *)local_170);
      std::__cxx11::string::~string((string *)(local_170 + 0x28));
      if (reread) {
        ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        initScanLine((partSizeData *)local_78,
                     (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)((long)ppVar1 + lVar9 + -0xc0),(FrameBuffer *)((long)ppVar1 + lVar9 + -0x48)
                     ,&inpart,(outHeaders->
                              super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)
                              ._M_impl.super__Vector_impl_data._M_start + local_1b8);
        std::__cxx11::string::~string((string *)(local_78 + 0x28));
      }
      readScanLine(&inpart,(FrameBuffer *)
                           ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar9 + -0x170),
                   (vector<double,_std::allocator<double>_> *)
                   ((long)(metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x60));
    }
    else {
      _Var5 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::TILEDIMAGE_abi_cxx11_);
      if (_Var5) {
        Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&inpart,in,iVar7);
        ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        initTiled((partSizeData *)local_170,
                  (vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   *)((long)ppVar1 + lVar9 + -0x1d0),
                  (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                  ((long)ppVar1 + lVar9 + -0x140),(TiledInputPart *)&inpart,
                  (outHeaders->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_1b8);
        partSizeData::operator=
                  ((partSizeData *)
                   ((long)&(((metrics->stats).
                             super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                             super__Vector_impl_data._M_start)->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + lVar8),
                   (partSizeData *)local_170);
        std::__cxx11::string::~string((string *)(local_170 + 0x28));
        if (reread) {
          ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          initTiled((partSizeData *)local_c0,
                    (vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                     *)((long)ppVar1 + lVar9 + -0xa8),
                    (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                    ((long)ppVar1 + lVar9 + -0x18),(TiledInputPart *)&inpart,
                    (outHeaders->
                    super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                    super__Vector_impl_data._M_start + local_1b8);
          std::__cxx11::string::~string((string *)(local_c0 + 0x28));
        }
        readTiled((TiledInputPart *)&inpart,
                  (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                  ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar9 + -0x140),
                  (vector<double,_std::allocator<double>_> *)
                  ((long)(metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar8 + -0x60));
      }
      else {
        _Var5 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
        if (_Var5) {
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&inpart,in,iVar7);
          ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          initAndReadDeepScanLine
                    ((partSizeData *)local_170,
                     (vector<int,_std::allocator<int>_> *)((long)ppVar1 + lVar9 + -0x1b8),
                     (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)((long)ppVar1 + lVar9 + -0x1a0),
                     (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      *)((long)ppVar1 + lVar9 + -0x188),
                     (DeepFrameBuffer *)((long)ppVar1 + lVar9 + -0x128),
                     (DeepScanLineInputPart *)&inpart,(vector<int,_std::allocator<int>_> *)0x0,
                     (outHeaders->
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                     super__Vector_impl_data._M_start + local_1b8,
                     (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x78),
                     (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x60));
          partSizeData::operator=
                    ((partSizeData *)
                     ((long)&(((metrics->stats).
                               super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                               super__Vector_impl_data._M_start)->countReadPerf).
                             super__Vector_base<double,_std::allocator<double>_> + lVar8),
                     (partSizeData *)local_170);
          std::__cxx11::string::~string((string *)(local_170 + 0x28));
          if (reread) {
            ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            initAndReadDeepScanLine
                      ((partSizeData *)local_170,
                       (vector<int,_std::allocator<int>_> *)((long)ppVar1 + lVar9 + -0x90),
                       (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        *)((long)ppVar1 + lVar9 + -0x78),
                       (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                        *)((long)ppVar1 + lVar9 + -0x60),
                       (DeepFrameBuffer *)
                       ((long)&(ppVar1->readBuf).scanlinePixelData.
                               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       + lVar9),(DeepScanLineInputPart *)&inpart,
                       (vector<int,_std::allocator<int>_> *)((long)ppVar1 + lVar9 + -0x1b8),
                       (outHeaders->
                       super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_1b8,
                       (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x78),
                       (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x60));
            partSizeData::operator=
                      ((partSizeData *)
                       ((long)&(((metrics->stats).
                                 super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                                 super__Vector_impl_data._M_start)->countReadPerf).
                               super__Vector_base<double,_std::allocator<double>_> + lVar8),
                       (partSizeData *)local_170);
            ppVar4 = (partSizeData *)local_170;
LAB_0010afa5:
            std::__cxx11::string::~string((string *)&ppVar4->partType);
          }
        }
        else {
          _Var5 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_3_4::DEEPTILE_abi_cxx11_);
          if (_Var5) {
            Imf_3_4::DeepTiledInputPart::DeepTiledInputPart((DeepTiledInputPart *)&inpart,in,iVar7);
            ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            initAndReadDeepTiled
                      ((partSizeData *)local_170,
                       (vector<int,_std::allocator<int>_> *)((long)ppVar1 + lVar9 + -0x1b8),
                       (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        *)((long)ppVar1 + lVar9 + -0x1a0),
                       (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                        *)((long)ppVar1 + lVar9 + -0x188),
                       (DeepFrameBuffer *)((long)ppVar1 + lVar9 + -0x128),
                       (DeepTiledInputPart *)&inpart,(vector<int,_std::allocator<int>_> *)0x0,
                       (outHeaders->
                       super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_1b8,
                       (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x78),
                       (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x60));
            partSizeData::operator=
                      ((partSizeData *)
                       ((long)&(((metrics->stats).
                                 super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                                 super__Vector_impl_data._M_start)->countReadPerf).
                               super__Vector_base<double,_std::allocator<double>_> + lVar8),
                       (partSizeData *)local_170);
            std::__cxx11::string::~string((string *)(local_170 + 0x28));
            if (reread) {
              ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              initAndReadDeepTiled
                        (&local_108,
                         (vector<int,_std::allocator<int>_> *)((long)ppVar1 + lVar9 + -0x90),
                         (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          *)((long)ppVar1 + lVar9 + -0x78),
                         (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                          *)((long)ppVar1 + lVar9 + -0x60),
                         (DeepFrameBuffer *)
                         ((long)&(ppVar1->readBuf).scanlinePixelData.
                                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         + lVar9),(DeepTiledInputPart *)&inpart,
                         (vector<int,_std::allocator<int>_> *)((long)ppVar1 + lVar9 + -0x1b8),
                         (outHeaders->
                         super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
                         _M_impl.super__Vector_impl_data._M_start + local_1b8,
                         (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x78),
                         (vector<double,_std::allocator<double>_> *)((long)ppVar2 + lVar8 + -0x60));
              ppVar4 = &local_108;
              goto LAB_0010afa5;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&type);
    uVar10 = uVar10 + 1;
    lVar8 = lVar8 + 0xc0;
    lVar9 = lVar9 + 0x250;
    local_1b8 = local_1b8 + 0x38;
  } while( true );
}

Assistant:

void
initAndReadFile (
    MultiPartInputFile&   in,
    const vector<Header>& outHeaders,
    int                   part,
    vector<partData>&     parts,
    fileMetrics&          metrics,
    bool                  reread)
{

    for (size_t p = 0; p < parts.size (); ++p)
    {

        int    readPart = (part == -1 ? p : part);
        string type     = in.header (readPart).type ();

        if (type == SCANLINEIMAGE)
        {
            InputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initScanLine (
                parts[p].readBuf.scanlinePixelData,
                parts[p].readBuf.scanlineBuf,
                inpart,
                outHeaders[p]);
            if (reread)
            {
                initScanLine (
                    parts[p].rereadBuf.scanlinePixelData,
                    parts[p].rereadBuf.scanlineBuf,
                    inpart,
                    outHeaders[p]);
            }
            readScanLine (
                inpart,
                parts[p].readBuf.scanlineBuf,
                metrics.stats[p].readPerf);
        }
        else if (type == TILEDIMAGE)
        {
            TiledInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initTiled (
                parts[p].readBuf.tilePixelData,
                parts[p].readBuf.tiledBuf,
                inpart,
                outHeaders[p]);
            if (reread)
            {
                initTiled (
                    parts[p].rereadBuf.tilePixelData,
                    parts[p].rereadBuf.tiledBuf,
                    inpart,
                    outHeaders[p]);
            }
            readTiled (
                inpart, parts[p].readBuf.tiledBuf, metrics.stats[p].readPerf);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initAndReadDeepScanLine (
                parts[p].readBuf.deepSampleCount,
                parts[p].readBuf.deepSampleData,
                parts[p].readBuf.deepSamplePtrs,
                parts[p].readBuf.deepbuf,
                inpart,
                nullptr,
                outHeaders[p],
                metrics.stats[p].countReadPerf,
                metrics.stats[p].readPerf);

            if (reread)
            {
                metrics.stats[p].sizeData = initAndReadDeepScanLine (
                    parts[p].rereadBuf.deepSampleCount,
                    parts[p].rereadBuf.deepSampleData,
                    parts[p].rereadBuf.deepSamplePtrs,
                    parts[p].rereadBuf.deepbuf,
                    inpart,
                    &parts[p].readBuf.deepSampleCount,
                    outHeaders[p],
                    metrics.stats[p].countReadPerf,
                    metrics.stats[p].readPerf);
            }
        }
        else if (type == DEEPTILE)
        {
            DeepTiledInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initAndReadDeepTiled (
                parts[p].readBuf.deepSampleCount,
                parts[p].readBuf.deepSampleData,
                parts[p].readBuf.deepSamplePtrs,
                parts[p].readBuf.deepbuf,
                inpart,
                nullptr,
                outHeaders[p],
                metrics.stats[p].countReadPerf,
                metrics.stats[p].readPerf);
            if (reread)
            {
                initAndReadDeepTiled (
                    parts[p].rereadBuf.deepSampleCount,
                    parts[p].rereadBuf.deepSampleData,
                    parts[p].rereadBuf.deepSamplePtrs,
                    parts[p].rereadBuf.deepbuf,
                    inpart,
                    &parts[p].readBuf.deepSampleCount,
                    outHeaders[p],
                    metrics.stats[p].countReadPerf,
                    metrics.stats[p].readPerf);
            }
        }
    }
}